

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O3

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::tryPumpFrom
          (BlockedPumpTo *this,AsyncInputStream *input,uint64_t amount2)

{
  PromiseArena *params;
  _func_int **pp_Var1;
  PromiseArena *pPVar2;
  OwnPromiseNode OVar3;
  PromiseArenaMember *pPVar4;
  void *pvVar5;
  PromiseArena *in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar6;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX_03;
  PromiseArena *pPVar7;
  Maybe<kj::Promise<unsigned_long>_> MVar8;
  OwnPromiseNode local_98;
  DebugExpression<bool> _kjCondition;
  PromiseArenaMember *local_88;
  TransformPromiseNodeBase *local_80;
  _func_int **local_60;
  OwnPromiseNode local_58;
  OwnPromiseNode local_50;
  Fault f;
  
  pPVar4 = local_88;
  _kjCondition.value = input[7]._vptr_AsyncInputStream == (_func_int **)0x0;
  if (!_kjCondition.value) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x550,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  pPVar7 = (PromiseArena *)
           ((long)input[5]._vptr_AsyncInputStream - (long)input[6]._vptr_AsyncInputStream);
  if (in_RCX < pPVar7) {
    pPVar7 = in_RCX;
  }
  (**(code **)(*input[4]._vptr_AsyncInputStream + 0x10))
            (&_kjCondition,input[4]._vptr_AsyncInputStream,amount2,pPVar7);
  if (_kjCondition.value == false) {
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 0;
    aVar6 = extraout_RDX;
  }
  else {
    params = (PromiseArena *)(input + 7);
    local_98.ptr = (PromiseNode *)local_88;
    local_88 = (PromiseArenaMember *)0x0;
    pp_Var1 = input[2]._vptr_AsyncInputStream;
    pPVar2 = pPVar4->arena;
    if (pPVar2 == (PromiseArena *)0x0 || (ulong)((long)pPVar4 - (long)pPVar2) < 0x50) {
      pvVar5 = operator_new(0x400);
      local_80 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3b0);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (local_80,&local_98,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1366:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_32_4_450de9d3_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3b0) = &PTR_destroy_006df068;
      *(AsyncInputStream **)((long)pvVar5 + 0x3d0) = input;
      *(uint64_t *)((long)pvVar5 + 0x3d8) = amount2;
      *(PromiseArena **)((long)pvVar5 + 0x3e0) = in_RCX;
      *(PromiseArena **)((long)pvVar5 + 1000) = pPVar7;
      *(_func_int ***)((long)pvVar5 + 0x3f0) = pp_Var1;
      *(PromiseArena **)((long)pvVar5 + 0x3f8) = params;
      *(void **)((long)pvVar5 + 0x3b8) = pvVar5;
    }
    else {
      pPVar4->arena = (PromiseArena *)0x0;
      local_80 = (TransformPromiseNodeBase *)(pPVar4 + -5);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (local_80,&local_98,
                 kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1366:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_32_4_450de9d3_for_func::operator());
      pPVar4[-5]._vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006df068;
      pPVar4[-3]._vptr_PromiseArenaMember = (_func_int **)input;
      pPVar4[-3].arena = (PromiseArena *)amount2;
      pPVar4[-2]._vptr_PromiseArenaMember = (_func_int **)in_RCX;
      pPVar4[-2].arena = pPVar7;
      pPVar4[-1]._vptr_PromiseArenaMember = pp_Var1;
      pPVar4[-1].arena = params;
      pPVar4[-5].arena = pPVar2;
    }
    local_50.ptr = &local_80->super_PromiseNode;
    f.exception = (Exception *)anon_var_dwarf_d0108e;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_58,&local_50,(SourceLocation *)&f);
    OVar3.ptr = local_50.ptr;
    if ((TransformPromiseNodeBase *)local_50.ptr != (TransformPromiseNodeBase *)0x0) {
      local_50.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
    }
    kj::_::PromiseDisposer::
    alloc<kj::_::AdapterPromiseNode<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>>,kj::_::PromiseDisposer,kj::Canceler&,kj::Promise<unsigned_long>>
              ((PromiseDisposer *)&local_60,(Canceler *)params,(Promise<unsigned_long> *)&local_58);
    OVar3.ptr = local_58.ptr;
    aVar6 = extraout_RDX_00;
    if (&(local_58.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
      aVar6 = extraout_RDX_01;
    }
    OVar3.ptr = local_98.ptr;
    *(undefined1 *)
     &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
      _vptr_AsyncInputStream = 1;
    (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
    _vptr_AsyncOutputStream = local_60;
    local_60 = (_func_int **)0x0;
    if (&(local_98.ptr)->super_PromiseArenaMember != (PromiseArenaMember *)0x0) {
      local_98.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(OVar3.ptr)->super_PromiseArenaMember);
      aVar6 = extraout_RDX_02;
    }
  }
  if (((_kjCondition.value & 1U) != 0) && (local_88 != (PromiseArenaMember *)0x0)) {
    kj::_::PromiseDisposer::dispose(local_88);
    aVar6 = extraout_RDX_03;
  }
  MVar8.ptr.field_1 = aVar6;
  MVar8.ptr._0_8_ = this;
  return (Maybe<kj::Promise<unsigned_long>_>)MVar8.ptr;
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}